

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

int predict_next(LexState *ls,FuncState *fs,BCPos pc)

{
  uint uVar1;
  GCtab *pGVar2;
  uint uVar3;
  int iVar4;
  GCstr *pGVar5;
  cTValue *pcVar6;
  byte local_52;
  byte local_51;
  cTValue *o;
  GCstr *name;
  BCIns ins;
  BCPos pc_local;
  FuncState *fs_local;
  LexState *ls_local;
  
  uVar1 = fs->bcbase[pc].ins;
  uVar3 = uVar1 & 0xff;
  if (uVar3 == 0x12) {
    o = (cTValue *)ls->vstack[fs->varmap[uVar1 >> 0x10]].name.gcptr64;
  }
  else {
    if (uVar3 != 0x2d) {
      if (uVar3 != 0x36) {
        return 0;
      }
      pGVar2 = fs->kt;
      pGVar5 = lj_str_new(ls->L,"pairs",5);
      pcVar6 = lj_tab_getstr(pGVar2,pGVar5);
      if (((pcVar6 != (cTValue *)0x0) && ((pcVar6->field_4).it == 0)) &&
         ((pcVar6->field_4).i == uVar1 >> 0x10)) {
        return 1;
      }
      pGVar2 = fs->kt;
      pGVar5 = lj_str_new(ls->L,"next",4);
      pcVar6 = lj_tab_getstr(pGVar2,pGVar5);
      if (((pcVar6 != (cTValue *)0x0) && ((pcVar6->field_4).it == 0)) &&
         ((pcVar6->field_4).i == uVar1 >> 0x10)) {
        return 1;
      }
      return 0;
    }
    o = (cTValue *)ls->vstack[fs->uvmap[uVar1 >> 0x10]].name.gcptr64;
  }
  if (*(int *)((long)o + 0x14) == 5) {
    iVar4 = strcmp((char *)&o[3].it64,"pairs");
    local_51 = 1;
    if (iVar4 == 0) goto LAB_00128329;
  }
  local_52 = 0;
  if (*(int *)((long)o + 0x14) == 4) {
    iVar4 = strcmp((char *)&o[3].it64,"next");
    local_52 = iVar4 != 0 ^ 0xff;
  }
  local_51 = local_52;
LAB_00128329:
  return (uint)(local_51 & 1);
}

Assistant:

static int predict_next(LexState *ls, FuncState *fs, BCPos pc)
{
  BCIns ins = fs->bcbase[pc].ins;
  GCstr *name;
  cTValue *o;
  switch (bc_op(ins)) {
  case BC_MOV:
    name = gco2str(gcref(var_get(ls, fs, bc_d(ins)).name));
    break;
  case BC_UGET:
    name = gco2str(gcref(ls->vstack[fs->uvmap[bc_d(ins)]].name));
    break;
  case BC_GGET:
    /* There's no inverse index (yet), so lookup the strings. */
    o = lj_tab_getstr(fs->kt, lj_str_newlit(ls->L, "pairs"));
    if (o && tvhaskslot(o) && tvkslot(o) == bc_d(ins))
      return 1;
    o = lj_tab_getstr(fs->kt, lj_str_newlit(ls->L, "next"));
    if (o && tvhaskslot(o) && tvkslot(o) == bc_d(ins))
      return 1;
    return 0;
  default:
    return 0;
  }
  return (name->len == 5 && !strcmp(strdata(name), "pairs")) ||
	 (name->len == 4 && !strcmp(strdata(name), "next"));
}